

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSetATimes_SPGMR(SUNLinearSolver S,void *ATData,SUNATimesFn ATimes)

{
  SUNATimesFn ATimes_local;
  void *ATData_local;
  SUNLinearSolver S_local;
  int local_4;
  
  if (S == (SUNLinearSolver)0x0) {
    local_4 = -0x321;
  }
  else {
    *(SUNATimesFn *)((long)S->content + 0x28) = ATimes;
    *(void **)((long)S->content + 0x30) = ATData;
    *(undefined4 *)((long)S->content + 0x20) = 0;
    local_4 = *(int *)((long)S->content + 0x20);
  }
  return local_4;
}

Assistant:

int SUNLinSolSetATimes_SPGMR(SUNLinearSolver S, void* ATData,
                             SUNATimesFn ATimes)
{
  /* set function pointers to integrator-supplied ATimes routine
     and data, and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPGMR_CONTENT(S)->ATimes = ATimes;
  SPGMR_CONTENT(S)->ATData = ATData;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}